

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

GLuint __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::genStorage
          (InterCallTestCase *this,int friendlyName)

{
  allocator<unsigned_int> *this_00;
  pointer *__return_storage_ptr__;
  allocator<int> *this_01;
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  size_type sVar8;
  long lVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  char (*local_620) [5];
  allocator<float> local_55d;
  value_type_conflict4 local_55c;
  undefined1 local_558 [8];
  vector<float,_std::allocator<float>_> zeroBuffer_3;
  undefined1 local_538 [8];
  vector<int,_std::allocator<int>_> zeroBuffer_2;
  unsigned_long local_3a0;
  MessageBuilder local_398;
  GLuint local_214;
  int local_210;
  GLuint retVal_1;
  int imageHeight;
  int imageWidth;
  undefined1 local_200 [8];
  vector<float,_std::allocator<float>_> zeroBuffer_1;
  undefined1 local_1e0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroBuffer;
  MessageBuilder local_1b8;
  GLuint local_34;
  int local_30;
  GLuint retVal;
  int bufferSize;
  int numElements;
  Functions *gl;
  InterCallTestCase *pIStack_18;
  int friendlyName_local;
  InterCallTestCase *this_local;
  
  gl._4_4_ = friendlyName;
  pIStack_18 = this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _bufferSize = CONCAT44(extraout_var,iVar3);
  if (this->m_storage == STORAGE_BUFFER) {
    retVal = this->m_invocationGridSize * this->m_invocationGridSize * this->m_perInvocationSize;
    local_30 = retVal * 4;
    local_34 = 0;
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [18])"Creating buffer #");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&gl + 4));
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])0xf34944);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_30);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])0xf971de);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    (**(code **)(_bufferSize + 0x6c8))(1,&local_34);
    (**(code **)(_bufferSize + 0x40))(0x90d2,local_34);
    if ((this->m_formatInteger & 1U) == 0) {
      sVar8 = (size_type)(int)retVal;
      imageWidth = 0;
      std::allocator<float>::allocator((allocator<float> *)((long)&imageHeight + 3));
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_200,sVar8,
                 (value_type_conflict4 *)&imageWidth,(allocator<float> *)((long)&imageHeight + 3));
      std::allocator<float>::~allocator((allocator<float> *)((long)&imageHeight + 3));
      pcVar1 = *(code **)(_bufferSize + 0x150);
      lVar9 = (long)local_30;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_200,0);
      (*pcVar1)(0x90d2,lVar9,pvVar11,0x88e4);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_200);
    }
    else {
      sVar8 = (size_type)(int)retVal;
      zeroBuffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_ = 0;
      this_00 = (allocator<unsigned_int> *)
                ((long)&zeroBuffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<unsigned_int>::allocator(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0,sVar8,
                 (value_type_conflict2 *)
                 ((long)&zeroBuffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),this_00);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&zeroBuffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 3));
      pcVar1 = *(code **)(_bufferSize + 0x150);
      lVar9 = (long)local_30;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0,0);
      (*pcVar1)(0x90d2,lVar9,pvVar10,0x88e4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
    }
    dVar4 = (**(code **)(_bufferSize + 0x800))();
    glu::checkError(dVar4,"gen buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x682);
    this_local._4_4_ = local_34;
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    retVal_1 = this->m_invocationGridSize;
    local_210 = this->m_invocationGridSize * this->m_perInvocationSize;
    local_214 = 0;
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_398,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_398,(char (*) [17])"Creating image #");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&gl + 4));
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])0xf34944);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&retVal_1);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xfb29fd);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_210);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])", internalformat = ");
    if ((this->m_formatInteger & 1U) == 0) {
      local_620 = (char (*) [5])0xf3581e;
    }
    else {
      local_620 = (char (*) [5])0xf35819;
    }
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_620);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])0xfade9d);
    local_3a0 = (long)(int)(retVal_1 * local_210) << 2;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3a0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])0xf971de);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_398);
    (**(code **)(_bufferSize + 0x6f8))(1,&local_214);
    (**(code **)(_bufferSize + 0xb8))(0xde1,local_214);
    if ((this->m_formatInteger & 1U) == 0) {
      (**(code **)(_bufferSize + 0x1380))(0xde1,1,0x822e,retVal_1,local_210);
    }
    else {
      (**(code **)(_bufferSize + 0x1380))(0xde1,1,0x8235,retVal_1,local_210);
    }
    (**(code **)(_bufferSize + 0x1360))(0xde1,0x2801);
    (**(code **)(_bufferSize + 0x1360))(0xde1,0x2800,0x2600);
    dVar4 = (**(code **)(_bufferSize + 0x800))();
    glu::checkError(dVar4,"gen image",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x69d);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    __return_storage_ptr__ =
         &zeroBuffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage;
    tcu::TestLog::operator<<
              ((MessageBuilder *)__return_storage_ptr__,pTVar6,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)__return_storage_ptr__,
                        (char (*) [21])"Filling image with 0");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &zeroBuffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((this->m_formatInteger & 1U) == 0) {
      iVar3 = retVal_1 * local_210;
      local_55c = 0.0;
      std::allocator<float>::allocator(&local_55d);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_558,(long)iVar3,&local_55c,
                 &local_55d);
      std::allocator<float>::~allocator(&local_55d);
      GVar2 = retVal_1;
      iVar3 = local_210;
      pcVar1 = *(code **)(_bufferSize + 0x13b8);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_558,0);
      (*pcVar1)(0xde1,0,0,0,GVar2,iVar3,0x1903,0x1406,pvVar11);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_558);
    }
    else {
      iVar3 = retVal_1 * local_210;
      zeroBuffer_3.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_ = 0;
      this_01 = (allocator<int> *)
                ((long)&zeroBuffer_3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<int>::allocator(this_01);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_538,(long)iVar3,
                 (value_type_conflict1 *)
                 ((long)&zeroBuffer_3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),this_01);
      std::allocator<int>::~allocator
                ((allocator<int> *)
                 ((long)&zeroBuffer_3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 3));
      GVar2 = retVal_1;
      iVar3 = local_210;
      pcVar1 = *(code **)(_bufferSize + 0x13b8);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_538,0);
      (*pcVar1)(0xde1,0,0,0,GVar2,iVar3,0x8d94,0x1404,pvVar12);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_538);
    }
    dVar4 = (**(code **)(_bufferSize + 0x800))();
    glu::checkError(dVar4,"specify image contents",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x6af);
    this_local._4_4_ = local_214;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLuint InterCallTestCase::genStorage (int friendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_storage == STORAGE_BUFFER)
	{
		const int		numElements		= m_invocationGridSize * m_invocationGridSize * m_perInvocationSize;
		const int		bufferSize		= numElements * (int)((m_formatInteger) ? (sizeof(deInt32)) : (sizeof(glw::GLfloat)));
		glw::GLuint		retVal			= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating buffer #" << friendlyName << ", size " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &retVal);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, retVal);

		if (m_formatInteger)
		{
			const std::vector<deUint32> zeroBuffer(numElements, 0);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		}
		else
		{
			const std::vector<float> zeroBuffer(numElements, 0.0f);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");

		return retVal;
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		const int	imageWidth	= m_invocationGridSize;
		const int	imageHeight	= m_invocationGridSize * m_perInvocationSize;
		glw::GLuint	retVal		= 0;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Creating image #" << friendlyName << ", size " << imageWidth << "x" << imageHeight
			<< ", internalformat = " << ((m_formatInteger) ? ("r32i") : ("r32f"))
			<< ", size = " << (imageWidth*imageHeight*sizeof(deUint32)) << " bytes."
			<< tcu::TestLog::EndMessage;

		gl.genTextures(1, &retVal);
		gl.bindTexture(GL_TEXTURE_2D, retVal);

		if (m_formatInteger)
			gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32I, imageWidth, imageHeight);
		else
			gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32F, imageWidth, imageHeight);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen image");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Filling image with 0"
			<< tcu::TestLog::EndMessage;

		if (m_formatInteger)
		{
			const std::vector<deInt32> zeroBuffer(imageWidth * imageHeight, 0);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageWidth, imageHeight, GL_RED_INTEGER, GL_INT, &zeroBuffer[0]);
		}
		else
		{
			const std::vector<float> zeroBuffer(imageWidth * imageHeight, 0.0f);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageWidth, imageHeight, GL_RED, GL_FLOAT, &zeroBuffer[0]);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "specify image contents");

		return retVal;
	}
	else
	{
		DE_ASSERT(DE_FALSE);
		return 0;
	}
}